

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retLvalue.c
# Opt level: O0

Vec_Ptr_t * Abc_ManCollectLatches(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *vLatches_00;
  Abc_Obj_t *pObj_00;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vLatches;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkLatchNum(pNtk);
  vLatches_00 = Vec_PtrAlloc(iVar1);
  Abc_NtkIncrementTravId(pNtk);
  for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_24 < iVar1; local_24 = local_24 + 1) {
    pObj_00 = Abc_NtkBox(pNtk,local_24);
    iVar1 = Abc_ObjIsLatch(pObj_00);
    if (iVar1 != 0) {
      Abc_ManCollectLatches_rec(pObj_00,vLatches_00);
    }
  }
  iVar1 = Vec_PtrSize(vLatches_00);
  iVar2 = Abc_NtkLatchNum(pNtk);
  if (iVar1 == iVar2) {
    return vLatches_00;
  }
  __assert_fail("Vec_PtrSize(vLatches) == Abc_NtkLatchNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retLvalue.c"
                ,0x15b,"Vec_Ptr_t *Abc_ManCollectLatches(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Abc_ManCollectLatches( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vLatches;
    Abc_Obj_t * pObj;
    int i;
    vLatches = Vec_PtrAlloc( Abc_NtkLatchNum(pNtk) );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachLatch( pNtk, pObj, i )
        Abc_ManCollectLatches_rec( pObj, vLatches );
    assert( Vec_PtrSize(vLatches) == Abc_NtkLatchNum(pNtk) );
    return vLatches;
}